

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mongo.c
# Opt level: O2

int op_insert(lua_State *L)

{
  int iVar1;
  int iVar2;
  char *key;
  int *piVar3;
  lua_Integer lVar4;
  uint *puVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  ulong n;
  size_t sz;
  buffer buf;
  luaL_Buffer b;
  
  sz = 0;
  key = luaL_checklstring(L,2,&sz);
  iVar1 = lua_isuserdata(L,3);
  if (iVar1 == 0) {
    iVar1 = lua_type(L,3);
    if (iVar1 == 5) {
      sVar6 = lua_rawlen(L,3);
      iVar1 = 0;
      uVar8 = sVar6 & 0xffffffff;
      if ((int)sVar6 < 1) {
        uVar8 = 0;
      }
      for (n = 1; n - uVar8 != 1; n = n + 1) {
        lua_rawgeti(L,3,n);
        piVar3 = (int *)lua_touserdata(L,-1);
        if (piVar3 == (int *)0x0) {
          lua_settop(L,-2);
          iVar1 = luaL_error(L,"Invalid document at %d",n & 0xffffffff);
          break;
        }
        iVar1 = iVar1 + *piVar3;
        lua_settop(L,-2);
      }
    }
    else {
      iVar1 = luaL_error(L,"Insert need documents");
    }
  }
  else {
    piVar3 = (int *)lua_touserdata(L,3);
    iVar1 = *piVar3;
  }
  luaL_buffinit(L,&b);
  buf.ptr = buf.buffer;
  buf.size = 0;
  buf.cap = 0x80;
  iVar2 = reserve_length(&buf);
  uVar8 = 0;
  write_int32(&buf,0);
  write_int32(&buf,0);
  write_int32(&buf,0x7d2);
  lVar4 = lua_tointegerx(L,1,(int *)0x0);
  write_int32(&buf,(int32_t)lVar4);
  write_string(&buf,key,sz);
  iVar1 = iVar1 + buf.size;
  lVar7 = (long)iVar2;
  buf.ptr[lVar7] = (uint8_t)iVar1;
  buf.ptr[lVar7 + 1] = (uint8_t)((uint)iVar1 >> 8);
  buf.ptr[lVar7 + 2] = (uint8_t)((uint)iVar1 >> 0x10);
  buf.ptr[lVar7 + 3] = (uint8_t)((uint)iVar1 >> 0x18);
  luaL_addlstring(&b,(char *)buf.ptr,(long)buf.size);
  buffer_destroy(&buf);
  iVar1 = lua_isuserdata(L,3);
  if (iVar1 == 0) {
    lVar7 = 1;
    sVar6 = lua_rawlen(L,3);
    if (0 < (int)sVar6) {
      uVar8 = sVar6 & 0xffffffff;
    }
    for (; lVar7 - uVar8 != 1; lVar7 = lVar7 + 1) {
      lua_rawgeti(L,3,lVar7);
      puVar5 = (uint *)lua_touserdata(L,-1);
      lua_settop(L,-2);
      luaL_addlstring(&b,(char *)puVar5,(ulong)*puVar5);
    }
  }
  else {
    puVar5 = (uint *)lua_touserdata(L,3);
    luaL_addlstring(&b,(char *)puVar5,(ulong)*puVar5);
  }
  luaL_pushresult(&b);
  return 1;
}

Assistant:

static int
op_insert(lua_State *L) {
	size_t sz = 0;
	const char * name = luaL_checklstring(L,2,&sz);
	int dsz = document_length(L);

	luaL_Buffer b;
	luaL_buffinit(L, &b);

	struct buffer buf;
	buffer_create(&buf);
		// make package header, don't raise L error
		int len = reserve_length(&buf);
		write_int32(&buf, 0);
		write_int32(&buf, 0);
		write_int32(&buf, OP_INSERT);
		write_int32(&buf, lua_tointeger(L,1));
		write_string(&buf, name, sz);

		int total = buf.size + dsz;
		write_length(&buf, total, len);

		luaL_addlstring(&b, (const char *)buf.ptr, buf.size);
	buffer_destroy(&buf);
	
	if (lua_isuserdata(L,3)) {
		document doc = lua_touserdata(L,3);
		luaL_addlstring(&b, (const char *)doc, get_length(doc));
	} else {
		int s = lua_rawlen(L, 3);
		int i;
		for (i=1;i<=s;i++) {
			lua_rawgeti(L,3,i);
			document doc = lua_touserdata(L,-1);
			lua_pop(L,1);	// must call lua_pop before luaL_addlstring, because addlstring may change stack top
			luaL_addlstring(&b, (const char *)doc, get_length(doc));
		}
	}

	luaL_pushresult(&b);

	return 1;
}